

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMTypeInfoImpl.cpp
# Opt level: O0

XMLCh * __thiscall
xercesc_4_0::DOMTypeInfoImpl::getStringProperty(DOMTypeInfoImpl *this,PSVIProperty prop)

{
  PSVIProperty prop_local;
  DOMTypeInfoImpl *this_local;
  
  switch(prop) {
  case PSVI_Type_Definition_Name:
    this_local = (DOMTypeInfoImpl *)this->fTypeName;
    break;
  case PSVI_Type_Definition_Namespace:
    this_local = (DOMTypeInfoImpl *)this->fTypeNamespace;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/dom/impl/DOMTypeInfoImpl.cpp"
                  ,0x87,
                  "virtual const XMLCh *xercesc_4_0::DOMTypeInfoImpl::getStringProperty(PSVIProperty) const"
                 );
  case PSVI_Member_Type_Definition_Name:
    this_local = (DOMTypeInfoImpl *)this->fMemberTypeName;
    break;
  case PSVI_Member_Type_Definition_Namespace:
    this_local = (DOMTypeInfoImpl *)this->fMemberTypeNamespace;
    break;
  case PSVI_Schema_Default:
    this_local = (DOMTypeInfoImpl *)this->fDefaultValue;
    break;
  case PSVI_Schema_Normalized_Value:
    this_local = (DOMTypeInfoImpl *)this->fNormalizedValue;
  }
  return (XMLCh *)this_local;
}

Assistant:

const XMLCh* DOMTypeInfoImpl::getStringProperty(PSVIProperty prop) const {
    switch(prop)
    {
    case PSVI_Type_Definition_Name:             return fTypeName;
    case PSVI_Type_Definition_Namespace:        return fTypeNamespace;
    case PSVI_Member_Type_Definition_Name:      return fMemberTypeName;
    case PSVI_Member_Type_Definition_Namespace: return fMemberTypeNamespace;
    case PSVI_Schema_Default:                   return fDefaultValue;
    case PSVI_Schema_Normalized_Value:          return fNormalizedValue;
    default:                                    assert(false); /* it's not a string property */
    }
    return 0;
}